

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O2

errr visuals_file_parser_finish(parser *parser)

{
  long lVar1;
  long *plVar2;
  void *p;
  visuals_color_cycle *pvVar3;
  visuals_color_cycle **ppvVar4;
  visuals_color_cycle *p_00;
  char *pcVar5;
  visuals_color_cycle *pvVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  void *pvVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  long local_58;
  
  p = parser_priv(parser);
  if (p == (void *)0x0) {
    visuals_cycler_table = (visuals_cycler *)0x0;
    goto LAB_001e4144;
  }
  sVar10 = 0xffffffffffffffff;
  lVar13 = 8;
  do {
    lVar13 = lVar13 + -8;
    lVar1 = sVar10 * 8;
    sVar10 = sVar10 + 1;
  } while (*(long *)(*(long *)((long)p + 0x30) + 8 + lVar1) != 0);
  if ((sVar10 == 0) ||
     (pvVar3 = (visuals_color_cycle *)mem_zalloc(0x10), pvVar3 == (visuals_color_cycle *)0x0)) {
LAB_001e40c6:
    pvVar3 = (visuals_color_cycle *)0x0;
  }
  else {
    ppvVar4 = (visuals_color_cycle **)mem_zalloc(-lVar13);
    pvVar3->steps = (uint8_t *)ppvVar4;
    p_00 = pvVar3;
    if (ppvVar4 == (visuals_color_cycle **)0x0) {
LAB_001e40c1:
      mem_free(p_00);
      goto LAB_001e40c6;
    }
    pvVar3->max_steps = sVar10;
    local_58 = 0;
    sVar7 = 0;
    while( true ) {
      sVar14 = 0xffffffffffffffff;
      lVar13 = 8;
      if (sVar10 == sVar7) break;
      do {
        lVar13 = lVar13 + -8;
        lVar1 = sVar14 * 8;
        sVar14 = sVar14 + 1;
      } while (*(long *)(*(long *)((long)p + 0x40) + local_58 + 8 + lVar1) != 0);
      if (sVar14 == 0) goto LAB_001e40c6;
      pcVar5 = *(char **)(*(long *)((long)p + 0x30) + sVar7 * 8);
      p_00 = (visuals_color_cycle *)mem_zalloc(0x18);
      if (p_00 == (visuals_color_cycle *)0x0) goto LAB_001e40c6;
      ppvVar4 = (visuals_color_cycle **)mem_zalloc(-lVar13);
      p_00->steps = (uint8_t *)ppvVar4;
      if (ppvVar4 == (visuals_color_cycle **)0x0) goto LAB_001e40c1;
      p_00->max_steps = sVar14;
      pcVar5 = string_make(pcVar5);
      p_00->cycle_name = pcVar5;
      sVar15 = 0;
      while (sVar14 != sVar15) {
        plVar2 = *(long **)(*(long *)((long)p + 0x40) + sVar7 * 0x200 + sVar15 * 8);
        if (plVar2 == (long *)0x0) {
          pvVar6 = (visuals_color_cycle *)0x0;
        }
        else {
          uVar11 = 0;
          for (lVar13 = 0; plVar2[1] != lVar13; lVar13 = lVar13 + 1) {
            uVar11 = uVar11 + (*(char *)(*plVar2 + lVar13) != (char)plVar2[3]);
          }
          pvVar6 = visuals_color_cycle_new((char *)plVar2[2],uVar11,(uint8_t)plVar2[3]);
          if (pvVar6 == (visuals_color_cycle *)0x0) {
            pvVar6 = (visuals_color_cycle *)0x0;
          }
          else {
            uVar8 = 0;
            uVar9 = 0;
            while ((uVar8 < (ulong)plVar2[1] && (uVar9 < uVar11))) {
              if (*(uint8_t *)(*plVar2 + uVar8) != (uint8_t)plVar2[3]) {
                pvVar6->steps[uVar9] = *(uint8_t *)(*plVar2 + uVar8);
                uVar9 = uVar9 + 1;
              }
              uVar8 = uVar8 + 1;
            }
          }
        }
        *(visuals_color_cycle **)((long)p_00->steps + sVar15 * 8) = pvVar6;
        ppvVar4 = (visuals_color_cycle **)((long)p_00->steps + sVar15 * 8);
        sVar15 = sVar15 + 1;
        if (*ppvVar4 == (visuals_color_cycle *)0x0) {
          pvVar3 = (visuals_color_cycle *)0x0;
          goto LAB_001e40c8;
        }
      }
      *(visuals_color_cycle **)((long)pvVar3->steps + sVar7 * 8) = p_00;
      sVar7 = sVar7 + 1;
      local_58 = local_58 + 0x200;
    }
  }
LAB_001e40c8:
  pvVar12 = *(void **)((long)p + 0x10);
  visuals_cycler_table = (visuals_cycler *)pvVar3;
  if (pvVar12 != (void *)0x0) {
    for (uVar11 = 0; uVar11 < *(ulong *)((long)p + 0x18); uVar11 = uVar11 + 1) {
      visuals_color_cycle_free(*(visuals_color_cycle **)((long)pvVar12 + uVar11 * 8));
      pvVar12 = *(void **)((long)p + 0x10);
    }
    mem_free(pvVar12);
    *(undefined8 *)((long)p + 0x10) = 0;
  }
  pvVar12 = *(void **)((long)p + 0x30);
  if (pvVar12 != (void *)0x0) {
    for (uVar11 = 0; uVar11 < *(ulong *)((long)p + 0x38); uVar11 = uVar11 + 1) {
      string_free(*(char **)((long)pvVar12 + uVar11 * 8));
      pvVar12 = *(void **)((long)p + 0x30);
    }
    mem_free(pvVar12);
    *(undefined8 *)((long)p + 0x30) = 0;
  }
  if (*(void **)((long)p + 0x40) != (void *)0x0) {
    mem_free(*(void **)((long)p + 0x40));
    *(undefined8 *)((long)p + 0x40) = 0;
  }
  mem_free(p);
LAB_001e4144:
  parser_destroy(parser);
  return (uint)(visuals_cycler_table == (visuals_cycler *)0x0) * 5;
}

Assistant:

static errr visuals_file_parser_finish(struct parser *parser)
{
	struct visuals_parse_context *context = parser_priv(parser);
	visuals_cycler_table = visuals_parse_context_convert(context);
	visuals_parse_context_free(context);
	parser_destroy(parser);
	return (visuals_cycler_table == NULL) ? PARSE_ERROR_INTERNAL : PARSE_ERROR_NONE;
}